

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

bool duckdb::ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
               (string_t *value,long *begin,long *end)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (*begin == 0) {
    *begin = 0;
    uVar3 = (ulong)(value->value).pointer.length;
    uVar2 = 0;
  }
  else {
    uVar2 = *begin - 1;
    *begin = uVar2;
    uVar3 = (ulong)(value->value).pointer.length;
    if (SBORROW8(uVar3,-uVar2) == (long)(uVar3 + uVar2) < 0 || -1 < (long)uVar2) {
      if ((long)uVar2 < 0) {
        uVar4 = uVar3 + 1 + uVar2;
      }
      else {
        uVar4 = uVar3;
        if (uVar2 <= uVar3) goto LAB_01a8a0af;
      }
      uVar2 = uVar4;
      *begin = uVar2;
    }
    else {
      lVar1 = *end;
      *begin = 0;
      uVar2 = 0;
      if (lVar1 < 0 && SBORROW8(lVar1,-uVar3) != (long)(lVar1 + uVar3) < 0) goto LAB_01a8a0d4;
    }
  }
LAB_01a8a0af:
  uVar4 = *end;
  if ((long)uVar4 < 0) {
    uVar3 = uVar3 + uVar4 + 1;
LAB_01a8a0c4:
    *end = uVar3;
    uVar2 = *begin;
    uVar4 = uVar3;
  }
  else if (uVar3 < uVar4) goto LAB_01a8a0c4;
  if ((long)uVar2 <= (long)uVar4) {
    uVar2 = uVar4;
  }
LAB_01a8a0d4:
  *end = uVar2;
  return SUB81(uVar2,0);
}

Assistant:

static bool ClampSlice(const INPUT_TYPE &value, INDEX_TYPE &begin, INDEX_TYPE &end) {
	// Clamp offsets
	begin = (begin != 0 && begin != (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) ? begin - 1 : begin;

	bool is_min = false;
	if (begin == (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) {
		begin++;
		is_min = true;
	}

	const auto length = OP::ValueLength(value);
	if (begin < 0 && -begin > length && end < 0 && end < -length) {
		begin = 0;
		end = 0;
		return true;
	}
	if (begin < 0 && -begin > length) {
		begin = 0;
	}
	ClampIndex(begin, value, length, is_min);
	ClampIndex(end, value, length, false);
	end = MaxValue<INDEX_TYPE>(begin, end);

	return true;
}